

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *pcVar2;
  bool bVar3;
  string *psVar4;
  cmValue cVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string currentStart;
  string cacheStart;
  string message;
  string srcList;
  ostringstream err;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  char *local_170;
  size_type local_168;
  pointer local_160;
  undefined8 local_158;
  char *local_150;
  ios_base local_128 [264];
  
  psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_198._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_198._0_8_ = psVar4->_M_string_length;
  local_188._0_8_ = 0xf;
  local_188._8_8_ = "/CMakeLists.txt";
  views._M_len = 2;
  views._M_array = (iterator)local_198;
  cmCatViews_abi_cxx11_(&local_1b8,views);
  bVar3 = cmsys::SystemTools::FileExists(&local_1b8);
  if (bVar3) {
    pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"CMAKE_HOME_DIRECTORY","");
    cVar5 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_188) {
      operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
    }
    if (cVar5.Value == (string *)0x0) {
      iVar8 = 0;
    }
    else {
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      paVar1 = &local_218.field_2;
      local_218._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"CMAKE_HOME_DIRECTORY","");
      psVar4 = (string *)cmState::GetInitializedCacheValue(pcVar2,&local_218);
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      local_198._8_8_ = (psVar4->_M_dataplus)._M_p;
      local_198._0_8_ = psVar4->_M_string_length;
      local_188._0_8_ = 0xf;
      local_188._8_8_ = "/CMakeLists.txt";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_198;
      cmCatViews_abi_cxx11_(&local_1f8,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      local_198._8_8_ = (psVar4->_M_dataplus)._M_p;
      local_198._0_8_ = psVar4->_M_string_length;
      local_188._0_8_ = 0xf;
      local_188._8_8_ = "/CMakeLists.txt";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_198;
      cmCatViews_abi_cxx11_(&local_218,views_01);
      bVar3 = cmsys::SystemTools::SameFile(&local_1f8,&local_218);
      if (!bVar3) {
        local_198._0_8_ = (pointer)0xc;
        local_198._8_8_ = "The source \"";
        local_188._0_8_ = local_218._M_string_length;
        local_188._8_8_ = local_218._M_dataplus._M_p;
        local_178 = 0x1d;
        local_170 = "\" does not match the source \"";
        local_168 = local_1f8._M_string_length;
        local_160 = local_1f8._M_dataplus._M_p;
        local_158 = 0x4a;
        local_150 = "\" used to generate cache.  Re-run cmake with a different source directory.";
        views_02._M_len = 5;
        views_02._M_array = (iterator)local_198;
        cmCatViews_abi_cxx11_(&local_1d8,views_02);
        cmSystemTools::Error(&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      iVar8 = (uint)bVar3 + (uint)bVar3 * 2 + -2;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    bVar3 = cmsys::SystemTools::FileIsDirectory(psVar4);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"The source directory \"",0x16);
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      lVar7 = 0x2d;
      pcVar9 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      bVar3 = cmsys::SystemTools::FileExists(psVar4);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"The source directory \"",0x16);
        psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_198,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        lVar7 = 0x1e;
        pcVar9 = "\" is a file, not a directory.\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"The source directory \"",0x16);
        psVar4 = cmState::GetSourceDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_198,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        lVar7 = 0x12;
        pcVar9 = "\" does not exist.\n";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "Specify --help for usage, or press the help button on the CMake GUI.",0x44);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    iVar8 = -2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      cmStrCat(*this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"),
               "/CMakeLists.txt");
    std::string currentStart =
      cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message =
        cmStrCat("The source \"", currentStart,
                 "\" does not match the source \"", cacheStart,
                 "\" used to generate cache.  Re-run cmake with a different "
                 "source directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}